

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  Geometry *pGVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  int iVar22;
  int iVar23;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar24;
  byte bVar25;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar26) [32];
  long lVar27;
  byte bVar28;
  byte bVar29;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  size_t sVar46;
  ulong uVar47;
  bool bVar48;
  ulong uVar49;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar50 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined4 uVar79;
  uint uVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar89 [64];
  undefined1 auVar90 [16];
  float fVar91;
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  long lStack_2690;
  StackItemT<embree::NodeRefPtr<8>_> *local_2670;
  undefined1 local_2648 [16];
  Geometry *local_2630;
  ulong local_2628;
  Scene *local_2620;
  ulong local_2618;
  long local_2610;
  RTCFilterFunctionNArguments args;
  undefined8 local_25d8;
  undefined8 uStack_25d0;
  undefined1 local_25c8 [16];
  undefined1 local_25b8 [16];
  undefined1 local_25a8 [16];
  undefined1 local_2598 [16];
  byte local_2587;
  float local_2578 [4];
  float local_2568 [4];
  undefined1 local_2558 [16];
  undefined1 local_2548 [16];
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [32];
  undefined1 local_24d8 [32];
  undefined1 local_24b8 [32];
  undefined1 local_2498 [32];
  undefined1 local_2478 [32];
  undefined8 local_2458;
  undefined8 uStack_2450;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  local_2670 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  auVar69 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar94 = ZEXT3264(auVar69);
  auVar70 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar95 = ZEXT3264(auVar70);
  auVar71 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar96 = ZEXT3264(auVar71);
  auVar50 = vmulss_avx512f(auVar69._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar79 = auVar50._0_4_;
  auVar72._4_4_ = uVar79;
  auVar72._0_4_ = uVar79;
  auVar72._8_4_ = uVar79;
  auVar72._12_4_ = uVar79;
  auVar72._16_4_ = uVar79;
  auVar72._20_4_ = uVar79;
  auVar72._24_4_ = uVar79;
  auVar72._28_4_ = uVar79;
  auVar50 = vmulss_avx512f(auVar70._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar80 = auVar50._0_4_;
  auVar50 = vmulss_avx512f(auVar71._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar30 = auVar50._0_4_;
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar35 = uVar32 ^ 0x20;
  auVar69 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar97 = ZEXT3264(auVar69);
  iVar2 = (tray->tfar).field_0.i[k];
  auVar84 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  auVar69._8_4_ = 0x80000000;
  auVar69._0_8_ = 0x8000000080000000;
  auVar69._12_4_ = 0x80000000;
  auVar69._16_4_ = 0x80000000;
  auVar69._20_4_ = 0x80000000;
  auVar69._24_4_ = 0x80000000;
  auVar69._28_4_ = 0x80000000;
  auVar69 = vxorps_avx512vl(auVar72,auVar69);
  auVar98 = ZEXT3264(auVar69);
  auVar70._0_8_ = CONCAT44(uVar80,uVar80) ^ 0x8000000080000000;
  auVar70._8_4_ = uVar80 ^ 0x80000000;
  auVar70._12_4_ = uVar80 ^ 0x80000000;
  auVar70._16_4_ = uVar80 ^ 0x80000000;
  auVar70._20_4_ = uVar80 ^ 0x80000000;
  auVar70._24_4_ = uVar80 ^ 0x80000000;
  auVar70._28_4_ = uVar80 ^ 0x80000000;
  auVar71._0_8_ = CONCAT44(uVar30,uVar30) ^ 0x8000000080000000;
  auVar71._8_4_ = uVar30 ^ 0x80000000;
  auVar71._12_4_ = uVar30 ^ 0x80000000;
  auVar71._16_4_ = uVar30 ^ 0x80000000;
  auVar71._20_4_ = uVar30 ^ 0x80000000;
  auVar71._24_4_ = uVar30 ^ 0x80000000;
  auVar71._28_4_ = uVar30 ^ 0x80000000;
  local_2508 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar69 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar92 = ZEXT3264(auVar69);
  auVar93 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  local_2618 = uVar32;
LAB_01d9e63c:
  do {
    if (local_2670 == stack) {
      return;
    }
    pSVar24 = local_2670 + -1;
    local_2670 = local_2670 + -1;
  } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar24->dist);
  sVar46 = (local_2670->ptr).ptr;
LAB_01d9e66a:
  do {
    if ((sVar46 & 8) != 0) break;
    pauVar26 = (undefined1 (*) [32])(sVar46 & 0xfffffffffffffff0);
    uVar79 = *(undefined4 *)(ray + k * 4 + 0x70);
    auVar75._4_4_ = uVar79;
    auVar75._0_4_ = uVar79;
    auVar75._8_4_ = uVar79;
    auVar75._12_4_ = uVar79;
    auVar75._16_4_ = uVar79;
    auVar75._20_4_ = uVar79;
    auVar75._24_4_ = uVar79;
    auVar75._28_4_ = uVar79;
    auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar26[8] + uVar32),auVar75,
                              *(undefined1 (*) [32])(pauVar26[2] + uVar32));
    auVar69 = vfmadd213ps_avx512vl(ZEXT1632(auVar50),auVar94._0_32_,auVar98._0_32_);
    auVar72 = vmaxps_avx512vl(auVar97._0_32_,auVar69);
    auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar26[8] + uVar34),auVar75,
                              *(undefined1 (*) [32])(pauVar26[2] + uVar34));
    auVar67 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar26[8] + uVar47),auVar75,
                              *(undefined1 (*) [32])(pauVar26[2] + uVar47));
    auVar69 = vfmadd213ps_avx512vl(ZEXT1632(auVar50),auVar95._0_32_,auVar70);
    auVar73 = vfmadd213ps_avx512vl(ZEXT1632(auVar67),auVar96._0_32_,auVar71);
    auVar69 = vmaxps_avx(auVar69,auVar73);
    auVar69 = vmaxps_avx(auVar72,auVar69);
    auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar26[8] + uVar35),auVar75,
                              *(undefined1 (*) [32])(pauVar26[2] + uVar35));
    auVar72 = vfmadd213ps_avx512vl(ZEXT1632(auVar50),auVar94._0_32_,auVar98._0_32_);
    auVar72 = vminps_avx(auVar84._0_32_,auVar72);
    auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar26[8] + (uVar34 ^ 0x20)),auVar75,
                              *(undefined1 (*) [32])(pauVar26[2] + (uVar34 ^ 0x20)));
    auVar67 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar26[8] + (uVar47 ^ 0x20)),auVar75,
                              *(undefined1 (*) [32])(pauVar26[2] + (uVar47 ^ 0x20)));
    auVar73 = vfmadd213ps_avx512vl(ZEXT1632(auVar50),auVar95._0_32_,auVar70);
    auVar74 = vfmadd213ps_avx512vl(ZEXT1632(auVar67),auVar96._0_32_,auVar71);
    auVar73 = vminps_avx(auVar73,auVar74);
    auVar72 = vminps_avx(auVar72,auVar73);
    uVar49 = vcmpps_avx512vl(auVar69,auVar72,2);
    if (((uint)sVar46 & 7) == 6) {
      uVar36 = vcmpps_avx512vl(auVar75,pauVar26[0xe],0xd);
      uVar37 = vcmpps_avx512vl(auVar75,pauVar26[0xf],1);
      uVar49 = uVar49 & uVar36 & uVar37;
    }
    bVar25 = (byte)uVar49;
    if (bVar25 == 0) goto LAB_01d9e63c;
    auVar72 = *pauVar26;
    auVar73 = pauVar26[1];
    auVar74 = vpternlogd_avx512vl(auVar92._0_32_,auVar69,auVar93._0_32_,0xf8);
    auVar75 = vpcompressd_avx512vl(auVar74);
    auVar76._0_4_ = (uint)(bVar25 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar25 & 1) * auVar74._0_4_;
    bVar48 = (bool)((byte)(uVar49 >> 1) & 1);
    auVar76._4_4_ = (uint)bVar48 * auVar75._4_4_ | (uint)!bVar48 * auVar74._4_4_;
    bVar48 = (bool)((byte)(uVar49 >> 2) & 1);
    auVar76._8_4_ = (uint)bVar48 * auVar75._8_4_ | (uint)!bVar48 * auVar74._8_4_;
    bVar48 = (bool)((byte)(uVar49 >> 3) & 1);
    auVar76._12_4_ = (uint)bVar48 * auVar75._12_4_ | (uint)!bVar48 * auVar74._12_4_;
    bVar48 = (bool)((byte)(uVar49 >> 4) & 1);
    auVar76._16_4_ = (uint)bVar48 * auVar75._16_4_ | (uint)!bVar48 * auVar74._16_4_;
    bVar48 = (bool)((byte)(uVar49 >> 5) & 1);
    auVar76._20_4_ = (uint)bVar48 * auVar75._20_4_ | (uint)!bVar48 * auVar74._20_4_;
    bVar48 = (bool)((byte)(uVar49 >> 6) & 1);
    auVar76._24_4_ = (uint)bVar48 * auVar75._24_4_ | (uint)!bVar48 * auVar74._24_4_;
    bVar48 = SUB81(uVar49 >> 7,0);
    auVar76._28_4_ = (uint)bVar48 * auVar75._28_4_ | (uint)!bVar48 * auVar74._28_4_;
    auVar74 = vpermt2q_avx512vl(auVar72,auVar76,auVar73);
    sVar46 = auVar74._0_8_;
    bVar25 = bVar25 - 1 & bVar25;
    if (bVar25 != 0) {
      auVar74 = vpshufd_avx2(auVar76,0x55);
      vpermt2q_avx512vl(auVar72,auVar74,auVar73);
      auVar75 = vpminsd_avx2(auVar76,auVar74);
      auVar74 = vpmaxsd_avx2(auVar76,auVar74);
      bVar25 = bVar25 - 1 & bVar25;
      if (bVar25 == 0) {
        auVar75 = vpermi2q_avx512vl(auVar75,auVar72,auVar73);
        sVar46 = auVar75._0_8_;
        auVar72 = vpermt2q_avx512vl(auVar72,auVar74,auVar73);
        (local_2670->ptr).ptr = auVar72._0_8_;
        lVar27 = 8;
        lStack_2690 = 0x10;
      }
      else {
        auVar17 = vpshufd_avx2(auVar76,0xaa);
        vpermt2q_avx512vl(auVar72,auVar17,auVar73);
        auVar78 = vpminsd_avx2(auVar75,auVar17);
        auVar75 = vpmaxsd_avx2(auVar75,auVar17);
        auVar17 = vpminsd_avx2(auVar74,auVar75);
        auVar75 = vpmaxsd_avx2(auVar74,auVar75);
        bVar25 = bVar25 - 1 & bVar25;
        if (bVar25 == 0) {
          auVar74 = vpermi2q_avx512vl(auVar78,auVar72,auVar73);
          sVar46 = auVar74._0_8_;
          auVar74 = vpermt2q_avx512vl(auVar72,auVar75,auVar73);
          (local_2670->ptr).ptr = auVar74._0_8_;
          auVar74 = vpermd_avx2(auVar75,auVar69);
          local_2670->dist = auVar74._0_4_;
          auVar72 = vpermt2q_avx512vl(auVar72,auVar17,auVar73);
          local_2670[1].ptr.ptr = auVar72._0_8_;
          lStack_2690 = 0x18;
          lVar27 = lStack_2690;
          lStack_2690 = 0x20;
          auVar74 = auVar17;
        }
        else {
          auVar74 = vpshufd_avx2(auVar76,0xff);
          vpermt2q_avx512vl(auVar72,auVar74,auVar73);
          auVar16 = vpminsd_avx2(auVar78,auVar74);
          auVar78 = vpmaxsd_avx2(auVar78,auVar74);
          auVar74 = vpminsd_avx2(auVar17,auVar78);
          auVar78 = vpmaxsd_avx2(auVar17,auVar78);
          auVar17 = vpminsd_avx2(auVar75,auVar78);
          auVar75 = vpmaxsd_avx2(auVar75,auVar78);
          bVar25 = bVar25 - 1 & bVar25;
          if (bVar25 != 0) {
            auVar77 = valignd_avx512vl(auVar76,auVar76,3);
            auVar76 = vpmovsxbd_avx2(ZEXT816(0x303020108));
            auVar78 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                           CONCAT48(0x80000000,0x8000000080000000)))
                                        ,auVar76,auVar16);
            auVar76 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
            auVar74 = vpermt2d_avx512vl(auVar78,auVar76,auVar74);
            auVar76 = vpermt2d_avx512vl(auVar74,auVar76,auVar17);
            auVar74 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
            auVar74 = vpermt2d_avx512vl(auVar76,auVar74,auVar75);
            auVar89 = ZEXT3264(auVar74);
            bVar29 = bVar25;
            do {
              auVar75 = auVar89._0_32_;
              auVar74._8_4_ = 1;
              auVar74._0_8_ = 0x100000001;
              auVar74._12_4_ = 1;
              auVar74._16_4_ = 1;
              auVar74._20_4_ = 1;
              auVar74._24_4_ = 1;
              auVar74._28_4_ = 1;
              auVar74 = vpermd_avx2(auVar74,auVar77);
              auVar77 = valignd_avx512vl(auVar77,auVar77,1);
              vpermt2q_avx512vl(auVar72,auVar77,auVar73);
              bVar29 = bVar29 - 1 & bVar29;
              uVar21 = vpcmpd_avx512vl(auVar74,auVar75,5);
              auVar74 = vpmaxsd_avx2(auVar74,auVar75);
              bVar28 = (byte)uVar21 << 1;
              auVar75 = valignd_avx512vl(auVar75,auVar75,7);
              bVar48 = (bool)((byte)uVar21 & 1);
              bVar8 = (bool)(bVar28 >> 2 & 1);
              bVar9 = (bool)(bVar28 >> 3 & 1);
              bVar10 = (bool)(bVar28 >> 4 & 1);
              bVar11 = (bool)(bVar28 >> 5 & 1);
              bVar12 = (bool)(bVar28 >> 6 & 1);
              auVar89 = ZEXT3264(CONCAT428((uint)(bVar28 >> 7) * auVar75._28_4_ |
                                           (uint)!(bool)(bVar28 >> 7) * auVar74._28_4_,
                                           CONCAT424((uint)bVar12 * auVar75._24_4_ |
                                                     (uint)!bVar12 * auVar74._24_4_,
                                                     CONCAT420((uint)bVar11 * auVar75._20_4_ |
                                                               (uint)!bVar11 * auVar74._20_4_,
                                                               CONCAT416((uint)bVar10 *
                                                                         auVar75._16_4_ |
                                                                         (uint)!bVar10 *
                                                                         auVar74._16_4_,
                                                                         CONCAT412((uint)bVar9 *
                                                                                   auVar75._12_4_ |
                                                                                   (uint)!bVar9 *
                                                                                   auVar74._12_4_,
                                                                                   CONCAT48((uint)
                                                  bVar8 * auVar75._8_4_ |
                                                  (uint)!bVar8 * auVar74._8_4_,
                                                  CONCAT44((uint)bVar48 * auVar75._4_4_ |
                                                           (uint)!bVar48 * auVar74._4_4_,
                                                           auVar74._0_4_))))))));
            } while (bVar29 != 0);
            lVar27 = (ulong)(uint)POPCOUNT((uint)bVar25) + 3;
            while( true ) {
              auVar75 = auVar89._0_32_;
              auVar74 = vpermt2q_avx512vl(auVar72,auVar75,auVar73);
              sVar46 = auVar74._0_8_;
              bVar48 = lVar27 == 0;
              lVar27 = lVar27 + -1;
              if (bVar48) break;
              (local_2670->ptr).ptr = sVar46;
              auVar74 = vpermd_avx2(auVar75,auVar69);
              local_2670->dist = auVar74._0_4_;
              auVar74 = valignd_avx512vl(auVar75,auVar75,1);
              auVar89 = ZEXT3264(auVar74);
              local_2670 = local_2670 + 1;
            }
            goto LAB_01d9e66a;
          }
          auVar76 = vpermi2q_avx512vl(auVar16,auVar72,auVar73);
          sVar46 = auVar76._0_8_;
          auVar76 = vpermt2q_avx512vl(auVar72,auVar75,auVar73);
          (local_2670->ptr).ptr = auVar76._0_8_;
          auVar75 = vpermd_avx2(auVar75,auVar69);
          local_2670->dist = auVar75._0_4_;
          auVar75 = vpermt2q_avx512vl(auVar72,auVar17,auVar73);
          local_2670[1].ptr.ptr = auVar75._0_8_;
          auVar75 = vpermd_avx2(auVar17,auVar69);
          local_2670[1].dist = auVar75._0_4_;
          auVar72 = vpermt2q_avx512vl(auVar72,auVar74,auVar73);
          local_2670[2].ptr.ptr = auVar72._0_8_;
          lVar27 = 0x28;
          lStack_2690 = 0x30;
        }
      }
      auVar69 = vpermd_avx2(auVar74,auVar69);
      *(int *)((long)&(local_2670->ptr).ptr + lVar27) = auVar69._0_4_;
      local_2670 = (StackItemT<embree::NodeRefPtr<8>_> *)
                   ((long)&(local_2670->ptr).ptr + lStack_2690);
    }
  } while( true );
  local_2610 = (ulong)((uint)sVar46 & 0xf) - 8;
  uVar49 = sVar46 & 0xfffffffffffffff0;
  for (lVar27 = 0; lVar27 != local_2610; lVar27 = lVar27 + 1) {
    lVar31 = lVar27 * 0x50;
    local_2620 = context->scene;
    pGVar5 = (local_2620->geometries).items[*(uint *)(uVar49 + 0x30 + lVar31)].ptr;
    fVar91 = (pGVar5->time_range).lower;
    fVar91 = pGVar5->fnumTimeSegments *
             ((*(float *)(ray + k * 4 + 0x70) - fVar91) / ((pGVar5->time_range).upper - fVar91));
    auVar50 = vroundss_avx(ZEXT416((uint)fVar91),ZEXT416((uint)fVar91),9);
    auVar50 = vminss_avx(auVar50,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
    auVar13 = vmaxss_avx(ZEXT816(0) << 0x20,auVar50);
    lVar33 = (long)(int)auVar13._0_4_ * 0x38;
    lVar6 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar33);
    auVar50 = *(undefined1 (*) [16])(lVar6 + (ulong)*(uint *)(uVar49 + lVar31) * 4);
    uVar36 = CONCAT44(0,*(uint *)(uVar49 + 0x10 + lVar31));
    local_2478._0_8_ = uVar36;
    auVar67 = *(undefined1 (*) [16])(lVar6 + uVar36 * 4);
    uVar37 = CONCAT44(0,*(uint *)(uVar49 + 0x20 + lVar31));
    local_2498._0_8_ = uVar37;
    auVar90 = *(undefined1 (*) [16])(lVar6 + uVar37 * 4);
    uVar38 = CONCAT44(0,*(uint *)(uVar49 + 4 + lVar31));
    local_24b8._0_8_ = uVar38;
    auVar51 = *(undefined1 (*) [16])(lVar6 + uVar38 * 4);
    uVar39 = CONCAT44(0,*(uint *)(uVar49 + 0x14 + lVar31));
    local_24d8._0_8_ = uVar39;
    auVar62 = *(undefined1 (*) [16])(lVar6 + uVar39 * 4);
    uVar40 = CONCAT44(0,*(uint *)(uVar49 + 0x24 + lVar31));
    local_24f8._0_8_ = uVar40;
    auVar64 = *(undefined1 (*) [16])(lVar6 + uVar40 * 4);
    uVar44 = (ulong)*(uint *)(uVar49 + 8 + lVar31);
    auVar52 = *(undefined1 (*) [16])(lVar6 + uVar44 * 4);
    uVar45 = (ulong)*(uint *)(uVar49 + 0x18 + lVar31);
    auVar54 = *(undefined1 (*) [16])(lVar6 + uVar45 * 4);
    uVar43 = (ulong)*(uint *)(uVar49 + 0x28 + lVar31);
    auVar65 = *(undefined1 (*) [16])(lVar6 + uVar43 * 4);
    uVar42 = (ulong)*(uint *)(uVar49 + 0xc + lVar31);
    auVar66 = *(undefined1 (*) [16])(lVar6 + uVar42 * 4);
    uVar41 = (ulong)*(uint *)(uVar49 + 0x1c + lVar31);
    auVar63 = *(undefined1 (*) [16])(lVar6 + uVar41 * 4);
    lVar33 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar33);
    uVar32 = (ulong)*(uint *)(uVar49 + 0x2c + lVar31);
    auVar53 = *(undefined1 (*) [16])(lVar6 + uVar32 * 4);
    auVar55 = *(undefined1 (*) [16])(lVar33 + (ulong)*(uint *)(uVar49 + lVar31) * 4);
    auVar56 = *(undefined1 (*) [16])(lVar33 + uVar36 * 4);
    auVar59 = *(undefined1 (*) [16])(lVar33 + uVar37 * 4);
    auVar57 = *(undefined1 (*) [16])(lVar33 + uVar38 * 4);
    auVar58 = *(undefined1 (*) [16])(lVar33 + uVar39 * 4);
    auVar60 = *(undefined1 (*) [16])(lVar33 + uVar40 * 4);
    auVar61 = *(undefined1 (*) [16])(lVar33 + uVar44 * 4);
    auVar81 = *(undefined1 (*) [16])(lVar33 + uVar45 * 4);
    auVar83 = *(undefined1 (*) [16])(lVar33 + uVar43 * 4);
    auVar68 = *(undefined1 (*) [16])(lVar33 + uVar42 * 4);
    auVar82 = *(undefined1 (*) [16])(lVar33 + uVar41 * 4);
    auVar4 = *(undefined1 (*) [16])(lVar33 + uVar32 * 4);
    puVar1 = (undefined8 *)(uVar49 + 0x30 + lVar31);
    local_2458 = *puVar1;
    uStack_2450 = puVar1[1];
    puVar1 = (undefined8 *)(uVar49 + 0x40 + lVar31);
    auVar14 = vunpcklps_avx(auVar50,auVar52);
    auVar50 = vunpckhps_avx(auVar50,auVar52);
    auVar52 = vunpcklps_avx(auVar51,auVar66);
    auVar51 = vunpckhps_avx(auVar51,auVar66);
    auVar66 = vunpcklps_avx(auVar50,auVar51);
    auVar15 = vunpcklps_avx(auVar14,auVar52);
    auVar50 = vunpckhps_avx(auVar14,auVar52);
    auVar52 = vunpcklps_avx(auVar67,auVar54);
    auVar67 = vunpckhps_avx(auVar67,auVar54);
    auVar54 = vunpcklps_avx(auVar62,auVar63);
    auVar51 = vunpckhps_avx(auVar62,auVar63);
    auVar62 = vunpcklps_avx(auVar67,auVar51);
    auVar63 = vunpcklps_avx(auVar52,auVar54);
    auVar67 = vunpckhps_avx(auVar52,auVar54);
    auVar52 = vunpcklps_avx(auVar90,auVar65);
    auVar90 = vunpckhps_avx(auVar90,auVar65);
    auVar54 = vunpcklps_avx(auVar64,auVar53);
    auVar51 = vunpckhps_avx(auVar64,auVar53);
    auVar64 = vunpcklps_avx(auVar90,auVar51);
    auVar65 = vunpcklps_avx(auVar52,auVar54);
    auVar90 = vunpckhps_avx(auVar52,auVar54);
    auVar51 = vunpcklps_avx512vl(auVar55,auVar61);
    auVar52 = vunpckhps_avx512vl(auVar55,auVar61);
    auVar53 = vunpcklps_avx512vl(auVar57,auVar68);
    auVar54 = vunpckhps_avx512vl(auVar57,auVar68);
    auVar52 = vunpcklps_avx(auVar52,auVar54);
    auVar54 = vunpcklps_avx(auVar51,auVar53);
    auVar51 = vunpckhps_avx(auVar51,auVar53);
    auVar53 = vunpcklps_avx512vl(auVar56,auVar81);
    auVar55 = vunpckhps_avx512vl(auVar56,auVar81);
    auVar56 = vunpcklps_avx512vl(auVar58,auVar82);
    auVar57 = vunpckhps_avx512vl(auVar58,auVar82);
    auVar55 = vunpcklps_avx512vl(auVar55,auVar57);
    auVar57 = vunpcklps_avx512vl(auVar53,auVar56);
    auVar56 = vunpckhps_avx512vl(auVar53,auVar56);
    auVar58 = vunpcklps_avx512vl(auVar59,auVar83);
    auVar53 = vunpckhps_avx512vl(auVar59,auVar83);
    auVar59 = vunpcklps_avx512vl(auVar60,auVar4);
    auVar60 = vunpckhps_avx512vl(auVar60,auVar4);
    auVar53 = vunpcklps_avx(auVar53,auVar60);
    auVar60 = vunpcklps_avx512vl(auVar58,auVar59);
    auVar59 = vunpckhps_avx512vl(auVar58,auVar59);
    auVar61 = ZEXT416((uint)(fVar91 - auVar13._0_4_));
    auVar58 = vbroadcastss_avx512vl(auVar61);
    auVar61 = vsubss_avx512f(ZEXT416(0x3f800000),auVar61);
    auVar81._0_4_ = auVar61._0_4_;
    auVar81._4_4_ = auVar81._0_4_;
    auVar81._8_4_ = auVar81._0_4_;
    auVar81._12_4_ = auVar81._0_4_;
    auVar54 = vmulps_avx512vl(auVar58,auVar54);
    auVar51 = vmulps_avx512vl(auVar58,auVar51);
    auVar61 = vmulps_avx512vl(auVar58,auVar52);
    auVar52 = vfmadd231ps_fma(auVar54,auVar81,auVar15);
    auVar54 = vfmadd231ps_fma(auVar51,auVar81,auVar50);
    auVar66 = vfmadd231ps_fma(auVar61,auVar81,auVar66);
    auVar50 = vmulps_avx512vl(auVar58,auVar57);
    auVar51 = vmulps_avx512vl(auVar58,auVar56);
    auVar55 = vmulps_avx512vl(auVar58,auVar55);
    auVar50 = vfmadd231ps_fma(auVar50,auVar81,auVar63);
    auVar67 = vfmadd231ps_fma(auVar51,auVar81,auVar67);
    auVar51 = vfmadd231ps_fma(auVar55,auVar81,auVar62);
    auVar62 = vmulps_avx512vl(auVar58,auVar60);
    auVar63 = vmulps_avx512vl(auVar58,auVar59);
    auVar53 = vmulps_avx512vl(auVar58,auVar53);
    auVar62 = vfmadd231ps_fma(auVar62,auVar81,auVar65);
    auVar65 = vfmadd231ps_fma(auVar63,auVar81,auVar90);
    auVar64 = vfmadd231ps_fma(auVar53,auVar81,auVar64);
    local_25d8 = *puVar1;
    uStack_25d0 = puVar1[1];
    auVar50 = vsubps_avx(auVar52,auVar50);
    auVar67 = vsubps_avx(auVar54,auVar67);
    auVar90 = vsubps_avx(auVar66,auVar51);
    auVar51 = vsubps_avx(auVar62,auVar52);
    auVar62 = vsubps_avx(auVar65,auVar54);
    auVar63 = vsubps_avx512vl(auVar64,auVar66);
    auVar64 = vmulps_avx512vl(auVar67,auVar63);
    local_2548 = vfmsub231ps_fma(auVar64,auVar62,auVar90);
    auVar53._0_4_ = auVar90._0_4_ * auVar51._0_4_;
    auVar53._4_4_ = auVar90._4_4_ * auVar51._4_4_;
    auVar53._8_4_ = auVar90._8_4_ * auVar51._8_4_;
    auVar53._12_4_ = auVar90._12_4_ * auVar51._12_4_;
    local_2538 = vfmsub231ps_avx512vl(auVar53,auVar63,auVar50);
    auVar55._0_4_ = auVar50._0_4_ * auVar62._0_4_;
    auVar55._4_4_ = auVar50._4_4_ * auVar62._4_4_;
    auVar55._8_4_ = auVar50._8_4_ * auVar62._8_4_;
    auVar55._12_4_ = auVar50._12_4_ * auVar62._12_4_;
    fVar91 = *(float *)(ray + k * 4 + 0x40);
    auVar56._4_4_ = fVar91;
    auVar56._0_4_ = fVar91;
    auVar56._8_4_ = fVar91;
    auVar56._12_4_ = fVar91;
    fVar85 = *(float *)(ray + k * 4 + 0x50);
    auVar59._4_4_ = fVar85;
    auVar59._0_4_ = fVar85;
    auVar59._8_4_ = fVar85;
    auVar59._12_4_ = fVar85;
    auVar65 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
    uVar79 = *(undefined4 *)(ray + k * 4);
    auVar64._4_4_ = uVar79;
    auVar64._0_4_ = uVar79;
    auVar64._8_4_ = uVar79;
    auVar64._12_4_ = uVar79;
    auVar53 = vsubps_avx512vl(auVar52,auVar64);
    local_2528 = vfmsub231ps_fma(auVar55,auVar51,auVar67);
    uVar79 = *(undefined4 *)(ray + k * 4 + 0x10);
    auVar52._4_4_ = uVar79;
    auVar52._0_4_ = uVar79;
    auVar52._8_4_ = uVar79;
    auVar52._12_4_ = uVar79;
    auVar55 = vsubps_avx512vl(auVar54,auVar52);
    uVar79 = *(undefined4 *)(ray + k * 4 + 0x20);
    auVar54._4_4_ = uVar79;
    auVar54._0_4_ = uVar79;
    auVar54._8_4_ = uVar79;
    auVar54._12_4_ = uVar79;
    auVar54 = vsubps_avx512vl(auVar66,auVar54);
    auVar66._0_4_ = fVar85 * auVar54._0_4_;
    auVar66._4_4_ = fVar85 * auVar54._4_4_;
    auVar66._8_4_ = fVar85 * auVar54._8_4_;
    auVar66._12_4_ = fVar85 * auVar54._12_4_;
    auVar66 = vfmsub231ps_avx512vl(auVar66,auVar55,auVar65);
    auVar64 = vmulps_avx512vl(auVar65,auVar53);
    auVar64 = vfmsub231ps_fma(auVar64,auVar54,auVar56);
    auVar58._0_4_ = fVar91 * auVar55._0_4_;
    auVar58._4_4_ = fVar91 * auVar55._4_4_;
    auVar58._8_4_ = fVar91 * auVar55._8_4_;
    auVar58._12_4_ = fVar91 * auVar55._12_4_;
    auVar52 = vfmsub231ps_fma(auVar58,auVar53,auVar59);
    auVar65 = vmulps_avx512vl(local_2528,auVar65);
    auVar65 = vfmadd231ps_avx512vl(auVar65,local_2538,auVar59);
    auVar56 = vfmadd231ps_avx512vl(auVar65,local_2548,auVar56);
    auVar65._8_4_ = 0x7fffffff;
    auVar65._0_8_ = 0x7fffffff7fffffff;
    auVar65._12_4_ = 0x7fffffff;
    local_2598 = vandps_avx512vl(auVar56,auVar65);
    auVar57._8_4_ = 0x80000000;
    auVar57._0_8_ = 0x8000000080000000;
    auVar57._12_4_ = 0x80000000;
    auVar65 = vandps_avx512vl(auVar56,auVar57);
    auVar63 = vmulps_avx512vl(auVar63,auVar52);
    auVar62 = vfmadd231ps_avx512vl(auVar63,auVar64,auVar62);
    auVar51 = vfmadd231ps_avx512vl(auVar62,auVar66,auVar51);
    local_25c8 = vxorps_avx512vl(auVar65,auVar51);
    auVar51._0_4_ = auVar90._0_4_ * auVar52._0_4_;
    auVar51._4_4_ = auVar90._4_4_ * auVar52._4_4_;
    auVar51._8_4_ = auVar90._8_4_ * auVar52._8_4_;
    auVar51._12_4_ = auVar90._12_4_ * auVar52._12_4_;
    auVar67 = vfmadd231ps_fma(auVar51,auVar67,auVar64);
    auVar50 = vfmadd231ps_fma(auVar67,auVar50,auVar66);
    local_25b8._0_4_ = (float)(auVar65._0_4_ ^ auVar50._0_4_);
    local_25b8._4_4_ = (float)(auVar65._4_4_ ^ auVar50._4_4_);
    local_25b8._8_4_ = (float)(auVar65._8_4_ ^ auVar50._8_4_);
    local_25b8._12_4_ = (float)(auVar65._12_4_ ^ auVar50._12_4_);
    auVar50 = ZEXT816(0) << 0x20;
    uVar21 = vcmpps_avx512vl(local_25c8,auVar50,5);
    uVar18 = vcmpps_avx512vl(local_25b8,auVar50,5);
    uVar19 = vcmpps_avx512vl(auVar56,auVar50,4);
    auVar50._0_4_ = local_25c8._0_4_ + local_25b8._0_4_;
    auVar50._4_4_ = local_25c8._4_4_ + local_25b8._4_4_;
    auVar50._8_4_ = local_25c8._8_4_ + local_25b8._8_4_;
    auVar50._12_4_ = local_25c8._12_4_ + local_25b8._12_4_;
    uVar20 = vcmpps_avx512vl(auVar50,local_2598,2);
    bVar25 = (byte)uVar21 & (byte)uVar18 & (byte)uVar19 & (byte)uVar20;
    if (bVar25 != 0) {
      auVar90._0_4_ = auVar54._0_4_ * local_2528._0_4_;
      auVar90._4_4_ = auVar54._4_4_ * local_2528._4_4_;
      auVar90._8_4_ = auVar54._8_4_ * local_2528._8_4_;
      auVar90._12_4_ = auVar54._12_4_ * local_2528._12_4_;
      auVar50 = vfmadd213ps_fma(auVar55,local_2538,auVar90);
      auVar50 = vfmadd213ps_fma(auVar53,local_2548,auVar50);
      uVar79 = *(undefined4 *)(ray + k * 4 + 0x30);
      auVar67._4_4_ = uVar79;
      auVar67._0_4_ = uVar79;
      auVar67._8_4_ = uVar79;
      auVar67._12_4_ = uVar79;
      auVar67 = vmulps_avx512vl(local_2598,auVar67);
      fVar91 = *(float *)(ray + k * 4 + 0x80);
      local_25a8._0_4_ = (float)(auVar65._0_4_ ^ auVar50._0_4_);
      local_25a8._4_4_ = (float)(auVar65._4_4_ ^ auVar50._4_4_);
      local_25a8._8_4_ = (float)(auVar65._8_4_ ^ auVar50._8_4_);
      local_25a8._12_4_ = (float)(auVar65._12_4_ ^ auVar50._12_4_);
      auVar62._0_4_ = fVar91 * local_2598._0_4_;
      auVar62._4_4_ = fVar91 * local_2598._4_4_;
      auVar62._8_4_ = fVar91 * local_2598._8_4_;
      auVar62._12_4_ = fVar91 * local_2598._12_4_;
      uVar21 = vcmpps_avx512vl(local_25a8,auVar62,2);
      uVar18 = vcmpps_avx512vl(auVar67,local_25a8,1);
      bVar25 = (byte)uVar21 & (byte)uVar18 & bVar25;
      if (bVar25 != 0) {
        local_2587 = bVar25;
        auVar50 = vrcp14ps_avx512vl(local_2598);
        auVar63._8_4_ = 0x3f800000;
        auVar63._0_8_ = 0x3f8000003f800000;
        auVar63._12_4_ = 0x3f800000;
        auVar67 = vfnmadd213ps_avx512vl(local_2598,auVar50,auVar63);
        auVar50 = vfmadd132ps_fma(auVar67,auVar50,auVar50);
        fVar85 = auVar50._0_4_;
        local_2558._0_4_ = fVar85 * local_25a8._0_4_;
        fVar86 = auVar50._4_4_;
        local_2558._4_4_ = fVar86 * local_25a8._4_4_;
        fVar87 = auVar50._8_4_;
        local_2558._8_4_ = fVar87 * local_25a8._8_4_;
        fVar88 = auVar50._12_4_;
        local_2558._12_4_ = fVar88 * local_25a8._12_4_;
        auVar84 = ZEXT1664(local_2558);
        local_2578[0] = fVar85 * local_25c8._0_4_;
        local_2578[1] = fVar86 * local_25c8._4_4_;
        local_2578[2] = fVar87 * local_25c8._8_4_;
        local_2578[3] = fVar88 * local_25c8._12_4_;
        local_2568[0] = fVar85 * local_25b8._0_4_;
        local_2568[1] = fVar86 * local_25b8._4_4_;
        local_2568[2] = fVar87 * local_25b8._8_4_;
        local_2568[3] = fVar88 * local_25b8._12_4_;
        auVar61._8_4_ = 0x7f800000;
        auVar61._0_8_ = 0x7f8000007f800000;
        auVar61._12_4_ = 0x7f800000;
        auVar50 = vblendmps_avx512vl(auVar61,local_2558);
        auVar60._0_4_ = (uint)(bVar25 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar25 & 1) * 0x7f800000;
        bVar48 = (bool)(bVar25 >> 1 & 1);
        auVar60._4_4_ = (uint)bVar48 * auVar50._4_4_ | (uint)!bVar48 * 0x7f800000;
        bVar48 = (bool)(bVar25 >> 2 & 1);
        auVar60._8_4_ = (uint)bVar48 * auVar50._8_4_ | (uint)!bVar48 * 0x7f800000;
        bVar48 = (bool)(bVar25 >> 3 & 1);
        auVar60._12_4_ = (uint)bVar48 * auVar50._12_4_ | (uint)!bVar48 * 0x7f800000;
        auVar50 = vshufps_avx(auVar60,auVar60,0xb1);
        auVar50 = vminps_avx(auVar50,auVar60);
        auVar67 = vshufpd_avx(auVar50,auVar50,1);
        auVar50 = vminps_avx(auVar67,auVar50);
        uVar21 = vcmpps_avx512vl(auVar60,auVar50,0);
        bVar29 = (byte)uVar21 & bVar25;
        do {
          bVar28 = bVar25;
          if (bVar29 != 0) {
            bVar28 = bVar29;
          }
          uVar80 = 0;
          for (uVar30 = (uint)bVar28; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x80000000) {
            uVar80 = uVar80 + 1;
          }
          local_2628 = (ulong)uVar80;
          uVar30 = *(uint *)((long)&local_2458 + local_2628 * 4);
          local_2630 = (local_2620->geometries).items[uVar30].ptr;
          if ((local_2630->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            bVar25 = ~(byte)(1 << (uVar80 & 0x1f)) & bVar25;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (local_2630->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar32 = (ulong)(uVar80 << 2);
              uVar79 = *(undefined4 *)((long)local_2578 + uVar32);
              uVar3 = *(undefined4 *)((long)local_2568 + uVar32);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2558 + uVar32);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2548 + uVar32);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2538 + uVar32);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2528 + uVar32);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar79;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_25d8 + uVar32);
              *(uint *)(ray + k * 4 + 0x120) = uVar30;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              break;
            }
            local_2518 = auVar84._0_16_;
            local_24f8 = auVar98._0_32_;
            local_24d8 = auVar97._0_32_;
            local_24b8 = auVar96._0_32_;
            local_2498 = auVar95._0_32_;
            local_2478 = auVar94._0_32_;
            uVar32 = (ulong)(uVar80 * 4);
            uVar79 = *(undefined4 *)((long)local_2578 + uVar32);
            h.u.field_0.i[1] = uVar79;
            h.u.field_0.i[0] = uVar79;
            h.u.field_0.i[2] = uVar79;
            h.u.field_0.i[3] = uVar79;
            h.v.field_0.v[0] = *(float *)((long)local_2568 + uVar32);
            h.geomID.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpbroadcastd_avx512vl()
            ;
            uVar79 = *(undefined4 *)((long)&local_25d8 + uVar32);
            h.primID.field_0.i[1] = uVar79;
            h.primID.field_0.i[0] = uVar79;
            h.primID.field_0.i[2] = uVar79;
            h.primID.field_0.i[3] = uVar79;
            uVar79 = *(undefined4 *)(local_2548 + uVar32);
            h.Ng.field_0._4_4_ = uVar79;
            h.Ng.field_0._0_4_ = uVar79;
            h.Ng.field_0._8_4_ = uVar79;
            h.Ng.field_0._12_4_ = uVar79;
            h.Ng.field_0._16_4_ = *(undefined4 *)(local_2538 + uVar32);
            uVar79 = *(undefined4 *)(local_2528 + uVar32);
            h.Ng.field_0._36_4_ = uVar79;
            h.Ng.field_0._32_4_ = uVar79;
            h.Ng.field_0._40_4_ = uVar79;
            h.Ng.field_0._44_4_ = uVar79;
            h.Ng.field_0._20_4_ = h.Ng.field_0._16_4_;
            h.Ng.field_0._24_4_ = h.Ng.field_0._16_4_;
            h.Ng.field_0._28_4_ = h.Ng.field_0._16_4_;
            h.v.field_0.v[1] = h.v.field_0.v[0];
            h.v.field_0.v[2] = h.v.field_0.v[0];
            h.v.field_0.v[3] = h.v.field_0.v[0];
            vpcmpeqd_avx2(ZEXT1632((undefined1  [16])h.u.field_0),
                          ZEXT1632((undefined1  [16])h.u.field_0));
            h.instID[0].field_0.i[1] = context->user->instID[0];
            h.instID[0].field_0.i[0] = h.instID[0].field_0.i[1];
            h.instID[0].field_0.i[2] = h.instID[0].field_0.i[1];
            h.instID[0].field_0.i[3] = h.instID[0].field_0.i[1];
            h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
            h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2558 + uVar32);
            local_2648 = local_2508;
            args.valid = (int *)local_2648;
            args.geometryUserPtr = local_2630->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)&h;
            args.N = 4;
            args.ray = (RTCRayN *)ray;
            if (local_2630->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*local_2630->intersectionFilterN)(&args);
            }
            uVar32 = vptestmd_avx512vl(local_2648,local_2648);
            if ((uVar32 & 0xf) == 0) {
LAB_01d9f2ed:
              *(float *)(ray + k * 4 + 0x80) = fVar91;
            }
            else {
              p_Var7 = context->args->filter;
              if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((local_2630->field_8).field_0x2 & 0x40) != 0))
                 )) {
                (*p_Var7)(&args);
              }
              uVar32 = vptestmd_avx512vl(local_2648,local_2648);
              uVar32 = uVar32 & 0xf;
              bVar29 = (byte)uVar32;
              if (bVar29 == 0) goto LAB_01d9f2ed;
              iVar2 = *(int *)(args.hit + 4);
              iVar22 = *(int *)(args.hit + 8);
              iVar23 = *(int *)(args.hit + 0xc);
              bVar48 = (bool)((byte)(uVar32 >> 1) & 1);
              bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
              bVar9 = SUB81(uVar32 >> 3,0);
              *(uint *)(args.ray + 0xc0) =
                   (uint)(bVar29 & 1) * *(int *)args.hit |
                   (uint)!(bool)(bVar29 & 1) * *(uint *)(args.ray + 0xc0);
              *(uint *)(args.ray + 0xc4) =
                   (uint)bVar48 * iVar2 | (uint)!bVar48 * *(int *)(args.ray + 0xc4);
              *(uint *)(args.ray + 200) =
                   (uint)bVar8 * iVar22 | (uint)!bVar8 * *(int *)(args.ray + 200);
              *(uint *)(args.ray + 0xcc) =
                   (uint)bVar9 * iVar23 | (uint)!bVar9 * *(int *)(args.ray + 0xcc);
              iVar2 = *(int *)(args.hit + 0x14);
              iVar22 = *(int *)(args.hit + 0x18);
              iVar23 = *(int *)(args.hit + 0x1c);
              bVar48 = (bool)((byte)(uVar32 >> 1) & 1);
              bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
              bVar9 = SUB81(uVar32 >> 3,0);
              *(uint *)(args.ray + 0xd0) =
                   (uint)(bVar29 & 1) * *(int *)(args.hit + 0x10) |
                   (uint)!(bool)(bVar29 & 1) * *(uint *)(args.ray + 0xd0);
              *(uint *)(args.ray + 0xd4) =
                   (uint)bVar48 * iVar2 | (uint)!bVar48 * *(int *)(args.ray + 0xd4);
              *(uint *)(args.ray + 0xd8) =
                   (uint)bVar8 * iVar22 | (uint)!bVar8 * *(int *)(args.ray + 0xd8);
              *(uint *)(args.ray + 0xdc) =
                   (uint)bVar9 * iVar23 | (uint)!bVar9 * *(int *)(args.ray + 0xdc);
              iVar2 = *(int *)(args.hit + 0x24);
              iVar22 = *(int *)(args.hit + 0x28);
              iVar23 = *(int *)(args.hit + 0x2c);
              bVar48 = (bool)((byte)(uVar32 >> 1) & 1);
              bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
              bVar9 = SUB81(uVar32 >> 3,0);
              *(uint *)(args.ray + 0xe0) =
                   (uint)(bVar29 & 1) * *(int *)(args.hit + 0x20) |
                   (uint)!(bool)(bVar29 & 1) * *(uint *)(args.ray + 0xe0);
              *(uint *)(args.ray + 0xe4) =
                   (uint)bVar48 * iVar2 | (uint)!bVar48 * *(int *)(args.ray + 0xe4);
              *(uint *)(args.ray + 0xe8) =
                   (uint)bVar8 * iVar22 | (uint)!bVar8 * *(int *)(args.ray + 0xe8);
              *(uint *)(args.ray + 0xec) =
                   (uint)bVar9 * iVar23 | (uint)!bVar9 * *(int *)(args.ray + 0xec);
              iVar2 = *(int *)(args.hit + 0x34);
              iVar22 = *(int *)(args.hit + 0x38);
              iVar23 = *(int *)(args.hit + 0x3c);
              bVar48 = (bool)((byte)(uVar32 >> 1) & 1);
              bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
              bVar9 = SUB81(uVar32 >> 3,0);
              *(uint *)(args.ray + 0xf0) =
                   (uint)(bVar29 & 1) * *(int *)(args.hit + 0x30) |
                   (uint)!(bool)(bVar29 & 1) * *(uint *)(args.ray + 0xf0);
              *(uint *)(args.ray + 0xf4) =
                   (uint)bVar48 * iVar2 | (uint)!bVar48 * *(int *)(args.ray + 0xf4);
              *(uint *)(args.ray + 0xf8) =
                   (uint)bVar8 * iVar22 | (uint)!bVar8 * *(int *)(args.ray + 0xf8);
              *(uint *)(args.ray + 0xfc) =
                   (uint)bVar9 * iVar23 | (uint)!bVar9 * *(int *)(args.ray + 0xfc);
              iVar2 = *(int *)(args.hit + 0x44);
              iVar22 = *(int *)(args.hit + 0x48);
              iVar23 = *(int *)(args.hit + 0x4c);
              bVar48 = (bool)((byte)(uVar32 >> 1) & 1);
              bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
              bVar9 = SUB81(uVar32 >> 3,0);
              *(uint *)(args.ray + 0x100) =
                   (uint)(bVar29 & 1) * *(int *)(args.hit + 0x40) |
                   (uint)!(bool)(bVar29 & 1) * *(uint *)(args.ray + 0x100);
              *(uint *)(args.ray + 0x104) =
                   (uint)bVar48 * iVar2 | (uint)!bVar48 * *(int *)(args.ray + 0x104);
              *(uint *)(args.ray + 0x108) =
                   (uint)bVar8 * iVar22 | (uint)!bVar8 * *(int *)(args.ray + 0x108);
              *(uint *)(args.ray + 0x10c) =
                   (uint)bVar9 * iVar23 | (uint)!bVar9 * *(int *)(args.ray + 0x10c);
              auVar50 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
              *(undefined1 (*) [16])(args.ray + 0x110) = auVar50;
              auVar50 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
              *(undefined1 (*) [16])(args.ray + 0x120) = auVar50;
              auVar50 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
              *(undefined1 (*) [16])(args.ray + 0x130) = auVar50;
              auVar50 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
              *(undefined1 (*) [16])(args.ray + 0x140) = auVar50;
              fVar91 = *(float *)(ray + k * 4 + 0x80);
            }
            auVar83._4_4_ = fVar91;
            auVar83._0_4_ = fVar91;
            auVar83._8_4_ = fVar91;
            auVar83._12_4_ = fVar91;
            auVar84 = ZEXT1664(local_2518);
            uVar21 = vcmpps_avx512vl(local_2518,auVar83,2);
            bVar25 = ~(byte)(1 << ((uint)local_2628 & 0x1f)) & bVar25 & (byte)uVar21;
            auVar94 = ZEXT3264(local_2478);
            auVar95 = ZEXT3264(local_2498);
            auVar96 = ZEXT3264(local_24b8);
            auVar97 = ZEXT3264(local_24d8);
            auVar98 = ZEXT3264(local_24f8);
          }
          if (bVar25 == 0) break;
          auVar82._8_4_ = 0x7f800000;
          auVar82._0_8_ = 0x7f8000007f800000;
          auVar82._12_4_ = 0x7f800000;
          auVar50 = vblendmps_avx512vl(auVar82,auVar84._0_16_);
          auVar68._0_4_ =
               (uint)(bVar25 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar25 & 1) * 0x7f800000;
          bVar48 = (bool)(bVar25 >> 1 & 1);
          auVar68._4_4_ = (uint)bVar48 * auVar50._4_4_ | (uint)!bVar48 * 0x7f800000;
          bVar48 = (bool)(bVar25 >> 2 & 1);
          auVar68._8_4_ = (uint)bVar48 * auVar50._8_4_ | (uint)!bVar48 * 0x7f800000;
          bVar48 = (bool)(bVar25 >> 3 & 1);
          auVar68._12_4_ = (uint)bVar48 * auVar50._12_4_ | (uint)!bVar48 * 0x7f800000;
          auVar50 = vshufps_avx(auVar68,auVar68,0xb1);
          auVar50 = vminps_avx(auVar50,auVar68);
          auVar67 = vshufpd_avx(auVar50,auVar50,1);
          auVar50 = vminps_avx(auVar67,auVar50);
          uVar21 = vcmpps_avx512vl(auVar68,auVar50,0);
          bVar29 = (byte)uVar21 & bVar25;
        } while( true );
      }
    }
    uVar32 = local_2618;
  }
  uVar79 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar84 = ZEXT3264(CONCAT428(uVar79,CONCAT424(uVar79,CONCAT420(uVar79,CONCAT416(uVar79,CONCAT412(
                                                  uVar79,CONCAT48(uVar79,CONCAT44(uVar79,uVar79)))))
                                               )));
  auVar69 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar92 = ZEXT3264(auVar69);
  auVar93 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  goto LAB_01d9e63c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }